

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
          (ConsoleLogger *this,char (*args) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char (*in_RDX) [10];
  ConsoleLogger *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  if (*(int *)((long)&in_RDI[3]._M_string_length + 4) < 1) {
    std::mutex::lock((mutex *)in_RDI);
    std::operator<<(*(ostream **)in_RDI,"    ");
    print<char[10],std::__cxx11::string>(in_RSI,in_RDX,in_RDI);
    std::mutex::unlock((mutex *)0x188b8f);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}